

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O2

int ffpkyu(fitsfile *fptr,char *keyname,char *comm,int *status)

{
  char valstring [71];
  char card [81];
  char local_c8 [80];
  char local_78 [96];
  
  if (0 < *status) {
    return *status;
  }
  local_c8[0] = ' ';
  local_c8[1] = '\0';
  ffmkky(keyname,local_c8,comm,local_78,status);
  ffprec(fptr,local_78,status);
  return *status;
}

Assistant:

int ffpkyu( fitsfile *fptr,     /* I - FITS file pointer        */
            const char *keyname,/* I - name of keyword to write */
            const char *comm,   /* I - keyword comment          */
            int  *status)       /* IO - error status            */
/*
  Write (put) a null-valued keyword and comment into the FITS header.  
*/
{
    char valstring[FLEN_VALUE];
    char card[FLEN_CARD];

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    strcpy(valstring," ");  /* create a dummy value string */
    ffmkky(keyname, valstring, comm, card, status);  /* construct the keyword */
    ffprec(fptr, card, status);

    return(*status);
}